

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_scan.hpp
# Opt level: O3

void __thiscall
duckdb::AlpRDScanState<double>::LoadVector<false>
          (AlpRDScanState<double> *this,EXACT_TYPE *value_buffer)

{
  uint8_t *left_encoded;
  uint8_t *right_encoded;
  uint16_t *puVar1;
  byte bVar2;
  ushort uVar3;
  byte bVar4;
  uint16_t exceptions_count;
  unsigned_long uVar5;
  unsigned_long uVar6;
  int remainder;
  uint val;
  ulong uVar7;
  ulong __n;
  data_ptr_t pdVar8;
  ulong uVar9;
  ulong values_count;
  
  (this->vector_state).index = 0;
  pdVar8 = this->metadata_ptr;
  this->metadata_ptr = pdVar8 + -4;
  values_count = this->count - this->total_value_count;
  if (0x3ff < values_count) {
    values_count = 0x400;
  }
  puVar1 = (uint16_t *)(this->segment_data + *(uint *)(pdVar8 + -4));
  (this->vector_state).exceptions_count = *puVar1;
  bVar2 = (this->vector_state).left_bit_width;
  val = (uint)values_count & 0x1f;
  if ((values_count & 0x1f) == 0) {
    bVar4 = (this->vector_state).right_bit_width;
    uVar9 = values_count;
    uVar7 = values_count;
  }
  else {
    uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    bVar4 = (this->vector_state).right_bit_width;
    uVar6 = NumericCastImpl<unsigned_long,_int,_false>::Convert(val);
    uVar9 = (values_count + 0x20) - uVar6;
    uVar7 = (values_count + 0x20) - uVar5;
  }
  __n = bVar2 * uVar7 >> 3;
  uVar7 = bVar4 * uVar9 >> 3;
  left_encoded = (this->vector_state).left_encoded;
  switchD_00b041bd::default(left_encoded,puVar1 + 1,__n);
  pdVar8 = (data_ptr_t)(__n + (long)(puVar1 + 1));
  right_encoded = (this->vector_state).right_encoded;
  switchD_00b041bd::default(right_encoded,pdVar8,uVar7);
  uVar3 = (this->vector_state).exceptions_count;
  if (uVar3 == 0) {
    exceptions_count = 0;
  }
  else {
    pdVar8 = pdVar8 + uVar7;
    switchD_00b041bd::default((this->vector_state).exceptions,pdVar8,(ulong)((uint)uVar3 * 2));
    uVar7 = (ulong)((uint)(this->vector_state).exceptions_count * 2);
    switchD_00b041bd::default((this->vector_state).exceptions_positions,pdVar8 + uVar7,uVar7);
    exceptions_count = (this->vector_state).exceptions_count;
  }
  *value_buffer = 0;
  alp::AlpRDDecompression<double>::Decompress
            (left_encoded,right_encoded,(this->vector_state).left_parts_dict,value_buffer,
             values_count,exceptions_count,(this->vector_state).exceptions,
             (this->vector_state).exceptions_positions,(this->vector_state).left_bit_width,
             (this->vector_state).right_bit_width);
  return;
}

Assistant:

void LoadVector(EXACT_TYPE *value_buffer) {
		vector_state.Reset();

		// Load the offset (metadata) indicating where the vector data starts
		metadata_ptr -= AlpRDConstants::METADATA_POINTER_SIZE;
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());

		idx_t vector_size = MinValue((idx_t)AlpRDConstants::ALP_VECTOR_SIZE, (count - total_value_count));

		data_ptr_t vector_ptr = segment_data + data_byte_offset;

		// Load the vector data
		vector_state.exceptions_count = Load<uint16_t>(vector_ptr);
		vector_ptr += AlpRDConstants::EXCEPTIONS_COUNT_SIZE;
		D_ASSERT(vector_state.exceptions_count <= vector_size);

		auto left_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.left_bit_width);
		auto right_bp_size = BitpackingPrimitives::GetRequiredSize(vector_size, vector_state.right_bit_width);

		memcpy(vector_state.left_encoded, (void *)vector_ptr, left_bp_size);
		vector_ptr += left_bp_size;

		memcpy(vector_state.right_encoded, (void *)vector_ptr, right_bp_size);
		vector_ptr += right_bp_size;

		if (vector_state.exceptions_count > 0) {
			memcpy(vector_state.exceptions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count);
			vector_ptr += AlpRDConstants::EXCEPTION_SIZE * vector_state.exceptions_count;
			memcpy(vector_state.exceptions_positions, (void *)vector_ptr,
			       AlpRDConstants::EXCEPTION_POSITION_SIZE * vector_state.exceptions_count);
		}

		// Decode all the vector values to the specified 'value_buffer'
		vector_state.template LoadValues<SKIP>(value_buffer, vector_size);
	}